

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_save.cpp
# Opt level: O0

void save_object_proc(ostream *os,Am_Load_Save_Context *context,Am_Value *value)

{
  bool bVar1;
  Am_Value *value_00;
  ostream *poVar2;
  undefined1 local_38 [8];
  Am_Save_Object_Method method;
  Am_Object object;
  Am_Value *value_local;
  Am_Load_Save_Context *context_local;
  ostream *os_local;
  
  Am_Object::Am_Object((Am_Object *)&method.Call,value);
  value_00 = Am_Object::Get((Am_Object *)&method.Call,0xb7,0);
  Am_Save_Object_Method::Am_Save_Object_Method((Am_Save_Object_Method *)local_38,value_00);
  bVar1 = Am_Save_Object_Method::Valid((Am_Save_Object_Method *)local_38);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar2 = std::operator<<(poVar2,"Object ");
    poVar2 = operator<<(poVar2,(Am_Object *)&method.Call);
    poVar2 = std::operator<<(poVar2," does not have a save method in its Am_SAVE_OBJECT_METHOD slot"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  (*(code *)method.from_wrapper)(os,context,&method.Call);
  Am_Object::~Am_Object((Am_Object *)&method.Call);
  return;
}

Assistant:

Am_Define_Method(Am_Save_Method, void, save_object,
                 (std::ostream & os, Am_Load_Save_Context &context,
                  const Am_Value &value))
{
  Am_Object object = value;
  Am_Save_Object_Method method = object.Get(Am_SAVE_OBJECT_METHOD);
  if (!method.Valid())
    Am_ERRORO(
        "Object "
            << object
            << " does not have a save method in its Am_SAVE_OBJECT_METHOD slot",
        object, Am_SAVE_OBJECT_METHOD);
  method.Call(os, context, object);
}